

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O1

void __thiscall Individual::Individual(Individual *this,int size)

{
  (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->coresAsignedToTasks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&this->coresAsignedToTasks,(long)size);
  return;
}

Assistant:

Individual::Individual(int size){
	coresAsignedToTasks.resize(size);
}